

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture3DProjLod(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  Texture3D *pTVar2;
  int i;
  long lVar3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  tcu local_20 [16];
  
  fVar1 = c->in[0].m_data[3];
  pTVar2 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            (local_20,(pTVar2->m_view).m_levels,(pTVar2->m_view).m_numLevels,&c->textures[0].sampler
             ,c->in[0].m_data[0] / fVar1,c->in[0].m_data[1] / fVar1,c->in[0].m_data[2] / fVar1,
             c->in[1].m_data[0]);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar3 = 0;
  do {
    local_48[lVar3] = *(float *)(local_20 + lVar3 * 4) * (p->scale).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_38 + lVar3 * 4) = local_48[lVar3] + (p->bias).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture3DProjLod	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), c.in[1].x())*p.scale + p.bias; }